

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O0

void test_int64(void)

{
  int iVar1;
  VALUE_TYPE VVar2;
  int32_t iVar3;
  uint32_t uVar4;
  int64_t iVar5;
  uint64_t uVar6;
  float fVar7;
  double dVar8;
  VALUE v;
  VALUE_TYPE in_stack_00000044;
  VALUE *in_stack_00000048;
  VALUE *in_stack_ffffffffffffffe8;
  VALUE *in_stack_fffffffffffffff8;
  
  iVar1 = value_init_int64(in_stack_ffffffffffffffe8,0x106ec0);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x10a,"%s","value_init_int64(NULL, 0) != 0");
  value_init_int64(in_stack_ffffffffffffffe8,0x106efe);
  VVar2 = value_type((VALUE *)&stack0xfffffffffffffff0);
  acutest_check_((int)(ulong)(VVar2 == VALUE_INT64),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x10d,"%s","value_type(&v) == VALUE_INT64");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x10e,"%s","!value_is_compatible(&v, VALUE_NULL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x10f,"%s","!value_is_compatible(&v, VALUE_BOOL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x110,"%s","value_is_compatible(&v, VALUE_INT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x111,"%s","value_is_compatible(&v, VALUE_UINT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x112,"%s","value_is_compatible(&v, VALUE_INT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x113,"%s","value_is_compatible(&v, VALUE_UINT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x114,"%s","value_is_compatible(&v, VALUE_FLOAT)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x115,"%s","value_is_compatible(&v, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x116,"%s","!value_is_compatible(&v, VALUE_ARRAY)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x117,"%s","!value_is_compatible(&v, VALUE_DICT)");
  iVar3 = value_int32((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar3 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x118,"%s","value_int32(&v) == 0");
  uVar4 = value_uint32((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(uVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x119,"%s","value_uint32(&v) == 0");
  iVar5 = value_int64((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar5 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x11a,"%s","value_int64(&v) == 0");
  uVar6 = value_uint64((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(uVar6 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x11b,"%s","value_uint64(&v) == 0");
  fVar7 = value_float((VALUE *)v.data._0_8_);
  iVar1 = FLOAT_EQ(fVar7,0.0);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x11c,"%s","FLOAT_EQ(value_float(&v), 0.0f)");
  dVar8 = value_double(in_stack_fffffffffffffff8);
  iVar1 = DOUBLE_EQ(dVar8,0.0);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x11d,"%s","DOUBLE_EQ(value_double(&v), 0.0)");
  value_fini((VALUE *)0x10732b);
  value_init_int64(in_stack_ffffffffffffffe8,0x10733c);
  VVar2 = value_type((VALUE *)&stack0xfffffffffffffff0);
  acutest_check_((int)(ulong)(VVar2 == VALUE_INT64),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x121,"%s","value_type(&v) == VALUE_INT64");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x122,"%s","!value_is_compatible(&v, VALUE_NULL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x123,"%s","!value_is_compatible(&v, VALUE_BOOL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x124,"%s","value_is_compatible(&v, VALUE_INT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x125,"%s","!value_is_compatible(&v, VALUE_UINT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x126,"%s","value_is_compatible(&v, VALUE_INT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x127,"%s","!value_is_compatible(&v, VALUE_UINT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x128,"%s","value_is_compatible(&v, VALUE_FLOAT)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x129,"%s","value_is_compatible(&v, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x12a,"%s","!value_is_compatible(&v, VALUE_ARRAY)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,299,"%s","!value_is_compatible(&v, VALUE_DICT)");
  iVar3 = value_int32((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar3 == -1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,300,"%s","value_int32(&v) == -1");
  iVar5 = value_int64((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar5 == -1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x12d,"%s","value_int64(&v) == -1");
  fVar7 = value_float((VALUE *)v.data._0_8_);
  iVar1 = FLOAT_EQ(fVar7,-1.0);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x12e,"%s","FLOAT_EQ(value_float(&v), -1.0f)");
  dVar8 = value_double(in_stack_fffffffffffffff8);
  iVar1 = DOUBLE_EQ(dVar8,-1.0);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x12f,"%s","DOUBLE_EQ(value_double(&v), -1.0)");
  value_fini((VALUE *)0x107702);
  value_init_int64(in_stack_ffffffffffffffe8,0x107716);
  VVar2 = value_type((VALUE *)&stack0xfffffffffffffff0);
  acutest_check_((int)(ulong)(VVar2 == VALUE_INT64),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x133,"%s","value_type(&v) == VALUE_INT64");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x134,"%s","!value_is_compatible(&v, VALUE_NULL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x135,"%s","!value_is_compatible(&v, VALUE_BOOL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x136,"%s","!value_is_compatible(&v, VALUE_INT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x137,"%s","!value_is_compatible(&v, VALUE_UINT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x138,"%s","value_is_compatible(&v, VALUE_INT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x139,"%s","!value_is_compatible(&v, VALUE_UINT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x13a,"%s","value_is_compatible(&v, VALUE_FLOAT)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x13b,"%s","value_is_compatible(&v, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x13c,"%s","!value_is_compatible(&v, VALUE_ARRAY)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x13d,"%s","!value_is_compatible(&v, VALUE_DICT)");
  iVar5 = value_int64((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar5 == -0x8000000000000000),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x13e,"%s","value_int64(&v) == INT64_MIN");
  fVar7 = value_float((VALUE *)v.data._0_8_);
  iVar1 = FLOAT_EQ(fVar7,-9.223372e+18);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x13f,"%s","FLOAT_EQ(value_float(&v), (float) INT64_MIN)");
  dVar8 = value_double(in_stack_fffffffffffffff8);
  iVar1 = DOUBLE_EQ(dVar8,-9.223372036854776e+18);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x140,"%s","DOUBLE_EQ(value_double(&v), (double) INT64_MIN)");
  value_fini((VALUE *)0x107aad);
  value_init_int64(in_stack_ffffffffffffffe8,0x107ac1);
  VVar2 = value_type((VALUE *)&stack0xfffffffffffffff0);
  acutest_check_((int)(ulong)(VVar2 == VALUE_INT64),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x144,"%s","value_type(&v) == VALUE_INT64");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x145,"%s","!value_is_compatible(&v, VALUE_NULL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x146,"%s","!value_is_compatible(&v, VALUE_BOOL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x147,"%s","!value_is_compatible(&v, VALUE_INT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x148,"%s","!value_is_compatible(&v, VALUE_UINT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x149,"%s","value_is_compatible(&v, VALUE_INT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x14a,"%s","value_is_compatible(&v, VALUE_UINT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x14b,"%s","value_is_compatible(&v, VALUE_FLOAT)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x14c,"%s","value_is_compatible(&v, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x14d,"%s","!value_is_compatible(&v, VALUE_ARRAY)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x14e,"%s","!value_is_compatible(&v, VALUE_DICT)");
  iVar5 = value_int64((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar5 == 0x7fffffffffffffff),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x14f,"%s","value_int64(&v) == INT64_MAX");
  uVar6 = value_uint64((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(uVar6 == 0x7fffffffffffffff),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x150,"%s","value_uint64(&v) == INT64_MAX");
  fVar7 = value_float((VALUE *)v.data._0_8_);
  iVar1 = FLOAT_EQ(fVar7,9.223372e+18);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x151,"%s","FLOAT_EQ(value_float(&v), (float) INT64_MAX)");
  dVar8 = value_double(in_stack_fffffffffffffff8);
  iVar1 = DOUBLE_EQ(dVar8,9.223372036854776e+18);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x152,"%s","DOUBLE_EQ(value_double(&v), (double) INT64_MAX)");
  value_fini((VALUE *)0x107e9a);
  return;
}

Assistant:

static void
test_int64(void)
{
    VALUE v;

    TEST_CHECK(value_init_int64(NULL, 0) != 0);

    value_init_int64(&v, 0);
    TEST_CHECK(value_type(&v) == VALUE_INT64);
    TEST_CHECK(!value_is_compatible(&v, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_BOOL));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_UINT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_UINT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_FLOAT));
    TEST_CHECK(value_is_compatible(&v, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&v, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DICT));
    TEST_CHECK(value_int32(&v) == 0);
    TEST_CHECK(value_uint32(&v) == 0);
    TEST_CHECK(value_int64(&v) == 0);
    TEST_CHECK(value_uint64(&v) == 0);
    TEST_CHECK(FLOAT_EQ(value_float(&v), 0.0f));
    TEST_CHECK(DOUBLE_EQ(value_double(&v), 0.0));
    value_fini(&v);

    value_init_int64(&v, -1);
    TEST_CHECK(value_type(&v) == VALUE_INT64);
    TEST_CHECK(!value_is_compatible(&v, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_BOOL));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT32));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT64));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_FLOAT));
    TEST_CHECK(value_is_compatible(&v, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&v, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DICT));
    TEST_CHECK(value_int32(&v) == -1);
    TEST_CHECK(value_int64(&v) == -1);
    TEST_CHECK(FLOAT_EQ(value_float(&v), -1.0f));
    TEST_CHECK(DOUBLE_EQ(value_double(&v), -1.0));
    value_fini(&v);

    value_init_int64(&v, INT64_MIN);
    TEST_CHECK(value_type(&v) == VALUE_INT64);
    TEST_CHECK(!value_is_compatible(&v, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_BOOL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_INT32));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT64));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_FLOAT));
    TEST_CHECK(value_is_compatible(&v, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&v, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DICT));
    TEST_CHECK(value_int64(&v) == INT64_MIN);
    TEST_CHECK(FLOAT_EQ(value_float(&v), (float) INT64_MIN));
    TEST_CHECK(DOUBLE_EQ(value_double(&v), (double) INT64_MIN));
    value_fini(&v);

    value_init_int64(&v, INT64_MAX);
    TEST_CHECK(value_type(&v) == VALUE_INT64);
    TEST_CHECK(!value_is_compatible(&v, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_BOOL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_INT32));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_UINT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_FLOAT));
    TEST_CHECK(value_is_compatible(&v, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&v, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DICT));
    TEST_CHECK(value_int64(&v) == INT64_MAX);
    TEST_CHECK(value_uint64(&v) == INT64_MAX);
    TEST_CHECK(FLOAT_EQ(value_float(&v), (float) INT64_MAX));
    TEST_CHECK(DOUBLE_EQ(value_double(&v), (double) INT64_MAX));
    value_fini(&v);
}